

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::Label::Label
          (Label *this,LabelType label_type,string *name,TypeVector *sig,size_t type_stack_size,
          size_t try_catch_stack_size,bool used)

{
  bool used_local;
  size_t try_catch_stack_size_local;
  size_t type_stack_size_local;
  TypeVector *sig_local;
  string *name_local;
  LabelType label_type_local;
  Label *this_local;
  
  this->label_type = label_type;
  this->name = name;
  this->sig = sig;
  this->type_stack_size = type_stack_size;
  this->try_catch_stack_size = try_catch_stack_size;
  this->used = used;
  return;
}

Assistant:

Label(LabelType label_type,
        const std::string& name,
        const TypeVector& sig,
        size_t type_stack_size,
        size_t try_catch_stack_size,
        bool used = false)
      : label_type(label_type),
        name(name),
        sig(sig),
        type_stack_size(type_stack_size),
        try_catch_stack_size(try_catch_stack_size),
        used(used) {}